

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char____char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,undefined8 branchIndex,
          NoInfer<kj::ArrayPtr<const_char>_> *first,NoInfer<kj::CappedArray<char,_14UL>_> *rest,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_1,NoInfer<kj::StringTree> *rest_2,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_3,NoInfer<kj::ArrayPtr<const_char>_> *rest_4,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_5,NoInfer<kj::ArrayPtr<const_char>_> *rest_6,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_7,NoInfer<kj::ArrayPtr<const_char>_> *rest_8,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_9,NoInfer<kj::CappedArray<char,_14UL>_> *rest_10,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_11,NoInfer<kj::StringTree> *rest_12,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_13,NoInfer<kj::String> *rest_14,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_15,NoInfer<kj::ArrayPtr<const_char>_> *rest_16,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_17,NoInfer<kj::ArrayPtr<const_char>_> *rest_18,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_19,NoInfer<kj::ArrayPtr<const_char>_> *rest_20,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_21,NoInfer<kj::String> *rest_22,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_23,NoInfer<kj::CappedArray<char,_14UL>_> *rest_24
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_25,NoInfer<kj::StringTree> *rest_26,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_27,NoInfer<kj::String> *rest_28,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_29,NoInfer<kj::ArrayPtr<const_char>_> *rest_30,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_31,NoInfer<kj::ArrayPtr<const_char>_> *rest_32,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_33,NoInfer<kj::ArrayPtr<const_char>_> *rest_34,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_35,NoInfer<kj::String> *rest_36,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_37,NoInfer<kj::CappedArray<char,_14UL>_> *rest_38
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_39,NoInfer<kj::StringTree> *rest_40,
          NoInfer<kj::StringTree> *rest_41,NoInfer<kj::ArrayPtr<const_char>_> *rest_42,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_43,NoInfer<kj::ArrayPtr<const_char>_> *rest_44,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_45,NoInfer<kj::ArrayPtr<const_char>_> *rest_46,
          NoInfer<kj::String> *rest_47,NoInfer<kj::ArrayPtr<const_char>_> *rest_48,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_49,NoInfer<kj::ArrayPtr<const_char>_> *rest_50,
          NoInfer<kj::String> *rest_51,NoInfer<kj::ArrayPtr<const_char>_> *rest_52,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_53,NoInfer<kj::ArrayPtr<const_char>_> *rest_54
          ,NoInfer<kj::StringTree> *rest_55,NoInfer<kj::ArrayPtr<const_char>_> *rest_56,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_57,NoInfer<kj::ArrayPtr<const_char>_> *rest_58,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_59,NoInfer<kj::ArrayPtr<const_char>_> *rest_60,
          NoInfer<kj::String> *rest_61,NoInfer<kj::ArrayPtr<const_char>_> *rest_62,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_63)

{
  ArrayPtr<const_char> *pAVar1;
  char *pcVar2;
  CappedArray<char,_14UL> *pCVar3;
  StringTree *pSVar4;
  ArrayPtr<const_char> *pAVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> *pAVar11;
  CappedArray<char,_14UL> *pCVar12;
  ArrayPtr<const_char> *pAVar13;
  StringTree *pSVar14;
  ArrayPtr<const_char> *pAVar15;
  String *pSVar16;
  ArrayPtr<const_char> *pAVar17;
  ArrayPtr<const_char> *pAVar18;
  ArrayPtr<const_char> *pAVar19;
  ArrayPtr<const_char> *pAVar20;
  ArrayPtr<const_char> *pAVar21;
  ArrayPtr<const_char> *pAVar22;
  ArrayPtr<const_char> *pAVar23;
  String *pSVar24;
  ArrayPtr<const_char> *pAVar25;
  CappedArray<char,_14UL> *pCVar26;
  ArrayPtr<const_char> *pAVar27;
  StringTree *pSVar28;
  ArrayPtr<const_char> *pAVar29;
  String *pSVar30;
  ArrayPtr<const_char> *pAVar31;
  ArrayPtr<const_char> *pAVar32;
  ArrayPtr<const_char> *pAVar33;
  ArrayPtr<const_char> *pAVar34;
  ArrayPtr<const_char> *pAVar35;
  ArrayPtr<const_char> *pAVar36;
  ArrayPtr<const_char> *pAVar37;
  String *pSVar38;
  ArrayPtr<const_char> *pAVar39;
  CappedArray<char,_14UL> *pCVar40;
  ArrayPtr<const_char> *pAVar41;
  StringTree *pSVar42;
  StringTree *pSVar43;
  ArrayPtr<const_char> *pAVar44;
  ArrayPtr<const_char> *pAVar45;
  ArrayPtr<const_char> *pAVar46;
  ArrayPtr<const_char> *pAVar47;
  ArrayPtr<const_char> *pAVar48;
  String *pSVar49;
  ArrayPtr<const_char> *pAVar50;
  ArrayPtr<const_char> *pAVar51;
  ArrayPtr<const_char> *pAVar52;
  String *pSVar53;
  ArrayPtr<const_char> *pAVar54;
  CappedArray<char,_14UL> *pCVar55;
  ArrayPtr<const_char> *pAVar56;
  StringTree *pSVar57;
  ArrayPtr<const_char> *pAVar58;
  ArrayPtr<const_char> *pAVar59;
  ArrayPtr<const_char> *pAVar60;
  ArrayPtr<const_char> *pAVar61;
  ArrayPtr<const_char> *pAVar62;
  String *pSVar63;
  ArrayPtr<const_char> *pAVar64;
  ArrayPtr<const_char> *pAVar65;
  ArrayPtr<const_char> *pAVar66;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000001f8;
  NoInfer<kj::String> *in_stack_00000200;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000208;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000210;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000218;
  NoInfer<kj::StringTree> *in_stack_00000220;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000228;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000230;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000238;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000240;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000248;
  NoInfer<kj::String> *in_stack_00000250;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000258;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000260;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000268;
  NoInfer<kj::String> *in_stack_00000270;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000278;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000280;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000288;
  NoInfer<kj::StringTree> *in_stack_00000290;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000298;
  NoInfer<kj::String> *in_stack_000002a0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002a8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002b0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002b8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002c0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002c8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002d0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002d8;
  NoInfer<kj::String> *in_stack_000002e0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002e8;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_000002f0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002f8;
  ArrayPtr<const_char> *rest_local_1;
  CappedArray<char,_14UL> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pcVar2 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pCVar3 = fwd<kj::CappedArray<char,14ul>>(rest);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pSVar4 = fwd<kj::StringTree>(rest_2);
  pAVar5 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  pCVar12 = fwd<kj::CappedArray<char,14ul>>(rest_10);
  pAVar13 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  pSVar14 = fwd<kj::StringTree>(rest_12);
  pAVar15 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pSVar16 = fwd<kj::String>(rest_14);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  pAVar19 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  pAVar20 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  pAVar21 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pAVar23 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pSVar24 = fwd<kj::String>(rest_22);
  pAVar25 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pCVar26 = fwd<kj::CappedArray<char,14ul>>(rest_24);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pSVar28 = fwd<kj::StringTree>(rest_26);
  pAVar29 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  pSVar30 = fwd<kj::String>(rest_28);
  pAVar31 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pAVar33 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  pAVar35 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  pAVar36 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pAVar37 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  pSVar38 = fwd<kj::String>(rest_36);
  pAVar39 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pCVar40 = fwd<kj::CappedArray<char,14ul>>(rest_38);
  pAVar41 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pSVar42 = fwd<kj::StringTree>(rest_40);
  pSVar43 = fwd<kj::StringTree>(rest_41);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  pAVar45 = fwd<kj::ArrayPtr<char_const>>(rest_43);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_44);
  pAVar47 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_46);
  pSVar49 = fwd<kj::String>(rest_47);
  pAVar50 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  pAVar51 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  pAVar52 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  pSVar53 = fwd<kj::String>(rest_51);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pCVar55 = fwd<kj::CappedArray<char,14ul>>(rest_53);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  pSVar57 = fwd<kj::StringTree>(rest_55);
  pAVar58 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pAVar59 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pAVar61 = fwd<kj::ArrayPtr<char_const>>(rest_59);
  pAVar62 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pSVar63 = fwd<kj::String>(rest_61);
  pAVar64 = fwd<kj::ArrayPtr<char_const>>(rest_62);
  pAVar65 = fwd<kj::ArrayPtr<char_const>>(rest_63);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(in_stack_000001f8);
  fwd<kj::String>(in_stack_00000200);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000208);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000210);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000218);
  fwd<kj::StringTree>(in_stack_00000220);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000248);
  fwd<kj::String>(in_stack_00000250);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000268);
  fwd<kj::String>(in_stack_00000270);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000280);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000288);
  fwd<kj::StringTree>(in_stack_00000290);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000298);
  fwd<kj::String>(in_stack_000002a0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002a8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002b0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002b8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002c0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002c8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002d0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002d8);
  fwd<kj::String>(in_stack_000002e0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002e8);
  fwd<kj::CappedArray<char,14ul>>(in_stack_000002f0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002f8);
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char____char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pcVar2,branchIndex,pCVar3,pAVar1,pSVar4,pAVar5,pAVar6,pAVar7,pAVar8,pAVar9,pAVar10
             ,pAVar11,pCVar12,pAVar13,pSVar14,pAVar15,pSVar16,pAVar17,pAVar18,pAVar19,pAVar20,
             pAVar21,pAVar22,pAVar23,pSVar24,pAVar25,pCVar26,pAVar27,pSVar28,pAVar29,pSVar30,pAVar31
             ,pAVar32,pAVar33,pAVar34,pAVar35,pAVar36,pAVar37,pSVar38,pAVar39,pCVar40,pAVar41,
             pSVar42,pSVar43,pAVar44,pAVar45,pAVar46,pAVar47,pAVar48,pSVar49,pAVar50,pAVar51,pAVar52
             ,pSVar53,pAVar54,pCVar55,pAVar56,pSVar57,pAVar58,pAVar59,pAVar60,pAVar61,pAVar62,
             pSVar63,pAVar64,pAVar65,pAVar66);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}